

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::NameResolver::VisitModule(NameResolver *this,Module *module)

{
  ExprVisitor *this_00;
  pointer ppFVar1;
  Func *func;
  pointer ppEVar2;
  Export *pEVar3;
  pointer ppGVar4;
  pointer ppEVar5;
  pointer ppEVar6;
  ElemSegment *pEVar7;
  pointer pEVar8;
  pointer ppDVar9;
  DataSegment *pDVar10;
  pointer ppVVar11;
  pointer ppEVar12;
  ElemExpr *elem_expr;
  pointer pEVar13;
  pointer ppFVar14;
  pointer ppGVar15;
  pointer ppEVar16;
  pointer ppEVar17;
  pointer ppDVar18;
  pointer ppVVar19;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this->current_module_ = module;
  CheckDuplicateBindings(this,&module->elem_segment_bindings,"elem");
  CheckDuplicateBindings(this,&module->func_bindings,"function");
  CheckDuplicateBindings(this,&module->global_bindings,"global");
  CheckDuplicateBindings(this,&module->type_bindings,"type");
  CheckDuplicateBindings(this,&module->table_bindings,"table");
  CheckDuplicateBindings(this,&module->memory_bindings,"memory");
  CheckDuplicateBindings(this,&module->event_bindings,"event");
  ppFVar1 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  this_00 = &this->visitor_;
  for (ppFVar14 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppFVar14 != ppFVar1;
      ppFVar14 = ppFVar14 + 1) {
    func = *ppFVar14;
    this->current_func_ = func;
    if ((func->decl).has_func_type == true) {
      ResolveFuncTypeVar(this,&(func->decl).type_var);
    }
    local_38 = std::
               _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/resolve-names.cc:423:7)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/resolve-names.cc:423:7)>
               ::_M_manager;
    local_50._M_unused._0_8_ = (undefined8)func;
    local_50._8_8_ = this;
    BindingHash::FindDuplicates(&func->bindings,(DuplicateCallback *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    ExprVisitor::VisitFunc(this_00,func);
    this->current_func_ = (Func *)0x0;
  }
  ppEVar2 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar12 = (module->exports).
                  super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppEVar12 != ppEVar2; ppEVar12 = ppEVar12 + 1) {
    pEVar3 = *ppEVar12;
    switch(pEVar3->kind) {
    case First:
      ResolveFuncVar(this,&pEVar3->var);
      break;
    case Table:
      ResolveTableVar(this,&pEVar3->var);
      break;
    case Memory:
      ResolveMemoryVar(this,&pEVar3->var);
      break;
    case Global:
      ResolveGlobalVar(this,&pEVar3->var);
      break;
    case Event:
      ResolveEventVar(this,&pEVar3->var);
    }
  }
  ppGVar4 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppGVar15 = (module->globals).
                  super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppGVar15 != ppGVar4; ppGVar15 = ppGVar15 + 1) {
    ExprVisitor::VisitExprList(this_00,&(*ppGVar15)->init_expr);
  }
  ppEVar5 = (module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar16 = (module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppEVar16 != ppEVar5;
      ppEVar16 = ppEVar16 + 1) {
    if (((*ppEVar16)->decl).has_func_type == true) {
      ResolveFuncTypeVar(this,&((*ppEVar16)->decl).type_var);
    }
  }
  ppEVar6 = (module->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppEVar17 = (module->elem_segments).
                  super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppEVar17 != ppEVar6;
      ppEVar17 = ppEVar17 + 1) {
    pEVar7 = *ppEVar17;
    ResolveTableVar(this,&pEVar7->table_var);
    ExprVisitor::VisitExprList(this_00,&pEVar7->offset);
    pEVar8 = (pEVar7->elem_exprs).
             super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pEVar13 = (pEVar7->elem_exprs).
                   super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>._M_impl.
                   super__Vector_impl_data._M_start; pEVar13 != pEVar8; pEVar13 = pEVar13 + 1) {
      if (pEVar13->kind == RefFunc) {
        ResolveFuncVar(this,&pEVar13->var);
      }
    }
  }
  ppDVar9 = (module->data_segments).
            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppDVar18 = (module->data_segments).
                  super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppDVar18 != ppDVar9;
      ppDVar18 = ppDVar18 + 1) {
    pDVar10 = *ppDVar18;
    ResolveMemoryVar(this,&pDVar10->memory_var);
    ExprVisitor::VisitExprList(this_00,&pDVar10->offset);
  }
  ppVVar11 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  for (ppVVar19 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppVVar19 != ppVVar11;
      ppVVar19 = ppVVar19 + 1) {
    ResolveFuncVar(this,*ppVVar19);
  }
  this->current_module_ = (Module *)0x0;
  return (Result)(this->result_).enum_;
}

Assistant:

Result NameResolver::VisitModule(Module* module) {
  current_module_ = module;
  CheckDuplicateBindings(&module->elem_segment_bindings, "elem");
  CheckDuplicateBindings(&module->func_bindings, "function");
  CheckDuplicateBindings(&module->global_bindings, "global");
  CheckDuplicateBindings(&module->type_bindings, "type");
  CheckDuplicateBindings(&module->table_bindings, "table");
  CheckDuplicateBindings(&module->memory_bindings, "memory");
  CheckDuplicateBindings(&module->event_bindings, "event");

  for (Func* func : module->funcs)
    VisitFunc(func);
  for (Export* export_ : module->exports)
    VisitExport(export_);
  for (Global* global : module->globals)
    VisitGlobal(global);
  for (Event* event : module->events)
    VisitEvent(event);
  for (ElemSegment* elem_segment : module->elem_segments)
    VisitElemSegment(elem_segment);
  for (DataSegment* data_segment : module->data_segments)
    VisitDataSegment(data_segment);
  for (Var* start : module->starts)
    ResolveFuncVar(start);
  current_module_ = nullptr;
  return result_;
}